

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O3

void __thiscall curlpp::HttpPost::clear(HttpPost *this)

{
  Forms *this_00;
  
  if (this->mFirst != (curl_httppost *)0x0) {
    curl_formfree();
    this->mFirst = (curl_httppost *)0x0;
    this->mLast = (curl_httppost *)0x0;
  }
  this_00 = &this->mForms;
  std::__cxx11::
  _List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  ::_M_clear(&this_00->
              super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
            );
  (this->mForms).
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->mForms).
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->mForms).
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

void
curlpp::HttpPost::clear()
{
  if(mFirst != NULL) {
    ::curl_formfree(mFirst);
    mFirst = NULL;
    mLast = NULL;
  }
  
  mForms.clear();
}